

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

string * cmCMakePresetsGraph::GetUserFilename(string *__return_storage_ptr__,string *sourceDir)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_str = (sourceDir->_M_dataplus)._M_p;
  local_38.View_._M_len = sourceDir->_M_string_length;
  local_68.View_._M_len = 0x16;
  local_68.View_._M_str = "/CMakeUserPresets.json";
  cmStrCat<>(__return_storage_ptr__,&local_38,&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakePresetsGraph::GetUserFilename(const std::string& sourceDir)
{
  return cmStrCat(sourceDir, "/CMakeUserPresets.json");
}